

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

HelicsFilter helicsCoreRegisterCloningFilter(HelicsCore core,char *name,HelicsError *err)

{
  string_view delivery;
  string_view name_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  pointer pFVar2;
  pointer pFVar3;
  allocator<char> *in_RSI;
  __sv_type _Var4;
  __single_object filt;
  shared_ptr<helics::Core> corePtr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
  *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *this_00;
  HelicsCore in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  allocator<char> *__s;
  FilterTypes type;
  char *in_stack_ffffffffffffff38;
  bool local_ba;
  allocator<char> local_b9;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
  *in_stack_ffffffffffffff48;
  HelicsCore in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  shared_ptr<helics::Core> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> local_40;
  undefined4 local_34;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_30;
  allocator<char> *local_18;
  HelicsFilter local_8;
  
  local_18 = in_RSI;
  getCoreSharedPtr(in_stack_ffffffffffffff08,(HelicsError *)in_stack_ffffffffffffff00);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_30);
  if (bVar1) {
    std::make_unique<helics::FilterObject>();
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get(&local_30);
    std::__cxx11::string::string(in_stack_ffffffffffffff00);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffef0);
    local_ba = local_18 == (allocator<char> *)0x0;
    if (local_ba) {
      std::__cxx11::string::string(this,in_stack_ffffffffffffff28);
      type = (FilterTypes)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    }
    else {
      __s = &local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,local_18);
      type = (FilterTypes)((ulong)__s >> 0x20);
      in_stack_ffffffffffffff20 = local_18;
    }
    local_ba = !local_ba;
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffef0);
    local_98 = (shared_ptr<helics::Core> *)_Var4._M_len;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var4._M_str;
    delivery._M_str = in_stack_ffffffffffffff38;
    delivery._M_len = (size_t)this;
    name_00._M_str = in_stack_ffffffffffffff58;
    name_00._M_len = (size_t)in_stack_ffffffffffffff50;
    helics::make_cloning_filter(type,(Core *)in_stack_ffffffffffffff20,delivery,name_00);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::operator->
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               0x1e6819);
    std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>::operator=
              ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::~unique_ptr
              ((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
               in_stack_ffffffffffffff00);
    std::__cxx11::string::~string(pbStack_90);
    if (local_ba) {
      std::allocator<char>::~allocator(&local_b9);
    }
    std::__cxx11::string::~string(pbStack_90);
    this_00 = &local_40;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::operator->
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               0x1e6876);
    pFVar2 = std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::get
                       ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
                        pbStack_90);
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e6891);
    pFVar3->filtPtr = pFVar2;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::operator->
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               0x1e68a4);
    std::shared_ptr<helics::Core>::operator=((shared_ptr<helics::Core> *)pbStack_90,local_98);
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e68c2);
    pFVar3->cloning = true;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               pbStack_90,
               (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               local_98);
    local_8 = anon_unknown.dwarf_88686::coreAddFilter
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (this_00);
    local_34 = 1;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (this_00);
  }
  else {
    local_8 = (HelicsFilter)0x0;
    local_34 = 1;
  }
  std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x1e6a36);
  return local_8;
}

Assistant:

HelicsFilter helicsCoreRegisterCloningFilter(HelicsCore core, const char* name, HelicsError* err)
{
    auto corePtr = getCoreSharedPtr(core, err);
    if (!corePtr) {
        return nullptr;
    }
    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->uFilter = helics::make_cloning_filter(helics::FilterTypes::CLONE, corePtr.get(), std::string{}, AS_STRING(name));
        filt->filtPtr = filt->uFilter.get();
        filt->corePtr = std::move(corePtr);
        filt->cloning = true;
        return coreAddFilter(core, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}